

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O3

Reals __thiscall
Omega_h::get_mident_metrics(Omega_h *this,Mesh *mesh,Int ent_dim,Reals *v2m,bool has_degen)

{
  int *piVar1;
  Alloc *this_00;
  Alloc *this_01;
  LO size_in;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  Reals RVar3;
  LOs e2e;
  LOs local_80;
  Read<int> local_70;
  Reals local_60;
  string local_50;
  void *pvVar2;
  
  size_in = Mesh::nents(mesh,ent_dim);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  Read<int>::Read(&local_70,size_in,0,1,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_80.write_.shared_alloc_.alloc = local_70.write_.shared_alloc_.alloc;
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.write_.shared_alloc_.alloc =
           (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_70.write_.shared_alloc_.alloc)->use_count =
           (local_70.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  this_00 = local_80.write_.shared_alloc_.alloc;
  local_80.write_.shared_alloc_.direct_ptr = local_70.write_.shared_alloc_.direct_ptr;
  local_60.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60.write_.shared_alloc_.alloc =
           (Alloc *)((local_60.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.write_.shared_alloc_.alloc)->use_count =
           (local_60.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  this_01 = local_60.write_.shared_alloc_.alloc;
  local_60.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
  RVar3 = get_mident_metrics(this,mesh,ent_dim,&local_80,&local_60,has_degen);
  pvVar2 = RVar3.write_.shared_alloc_.direct_ptr;
  if (((ulong)this_01 & 7) == 0 && this_01 != (Alloc *)0x0) {
    piVar1 = &this_01->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_01);
      operator_delete(this_01,0x48);
      pvVar2 = extraout_RDX;
    }
  }
  if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
      pvVar2 = extraout_RDX_00;
    }
  }
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
      operator_delete(local_70.write_.shared_alloc_.alloc,0x48);
      pvVar2 = extraout_RDX_01;
    }
  }
  RVar3.write_.shared_alloc_.direct_ptr = pvVar2;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals get_mident_metrics(Mesh* mesh, Int ent_dim, Reals v2m, bool has_degen) {
  LOs e2e(mesh->nents(ent_dim), 0, 1);
  return get_mident_metrics(mesh, ent_dim, e2e, v2m, has_degen);
}